

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d_utils.h
# Opt level: O1

Array2D<interval> *
TNT::operator-(Array2D<interval> *__return_storage_ptr__,Array2D<interval> *A,Array2D<interval> *B)

{
  uint m;
  uint n;
  long lVar1;
  ulong uVar2;
  interval local_48;
  
  m = A->m_;
  if (B->m_ == m) {
    n = A->n_;
    if (B->n_ == n) {
      Array2D<interval>::Array2D(__return_storage_ptr__,m,n);
      if ((int)m < 1) {
        return __return_storage_ptr__;
      }
      uVar2 = 0;
      do {
        if (0 < (int)n) {
          lVar1 = 0;
          do {
            ::operator-((interval *)((long)&(A->v_).data_[uVar2]->inf + lVar1),
                        (interval *)((long)&(B->v_).data_[uVar2]->inf + lVar1));
            interval::operator=((interval *)
                                ((long)&(__return_storage_ptr__->v_).data_[uVar2]->inf + lVar1),
                                &local_48);
            lVar1 = lVar1 + 0x18;
          } while ((ulong)n * 0x18 != lVar1);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != m);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->data_).v_.data_ = (interval *)0x0;
  (__return_storage_ptr__->data_).v_.ref_count_ = (int *)0x0;
  (__return_storage_ptr__->data_).n_ = 0;
  (__return_storage_ptr__->data_).data_ = (interval *)0x0;
  (__return_storage_ptr__->v_).v_.data_ = (interval **)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->v_).v_.data_ + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->v_).v_.ref_count_ + 4) = 0;
  (__return_storage_ptr__->v_).data_ = (interval **)0x0;
  __return_storage_ptr__->m_ = 0;
  __return_storage_ptr__->n_ = 0;
  return __return_storage_ptr__;
}

Assistant:

Array2D<T> operator-(const Array2D<T> &A, const Array2D<T> &B)
{
	int m = A.dim1();
	int n = A.dim2();

	if (B.dim1() != m ||  B.dim2() != n )
		return Array2D<T>();

	else
	{
		Array2D<T> C(m,n);

		for (int i=0; i<m; i++)
		{
			for (int j=0; j<n; j++)
				C[i][j] = A[i][j] - B[i][j];
		}
		return C;
	}
}